

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derDec4(octet *der,size_t count,u32 tag,void *val,size_t len)

{
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  u32 t;
  size_t l;
  octet *v;
  
  sVar2 = derDec(&t,&v,&l,der,count);
  sVar3 = 0xffffffffffffffff;
  if (((sVar2 != 0xffffffffffffffff) && (t == tag)) && (l == len)) {
    bVar1 = memEq(v,val,len);
    sVar3 = -(ulong)(bVar1 == 0) | sVar2;
  }
  return sVar3;
}

Assistant:

size_t derDec4(const octet der[], size_t count, u32 tag, const void* val,
	size_t len)
{
	u32 t;
	const octet* v;
	size_t l;
	ASSERT(memIsValid(val, len));
	count = derDec(&t, &v, &l, der, count);
	if (count == SIZE_MAX || t != tag || l != len || !memEq(v, val, len))
		return SIZE_MAX;
	return count;
}